

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O3

bool __thiscall
google::protobuf::io::CodedInputStream::ReadRaw(CodedInputStream *this,void *buffer,int size)

{
  uint8 *__src;
  bool bVar1;
  int iVar2;
  int iVar3;
  size_t __n;
  
  do {
    iVar2 = size;
    __src = this->buffer_;
    iVar3 = (int)this->buffer_end_ - (int)__src;
    if (iVar2 - iVar3 == 0 || iVar2 < iVar3) {
      memcpy(buffer,__src,(long)iVar2);
      this->buffer_ = this->buffer_ + iVar2;
      break;
    }
    __n = (size_t)iVar3;
    memcpy(buffer,__src,__n);
    buffer = (void *)((long)buffer + __n);
    this->buffer_ = this->buffer_ + __n;
    bVar1 = Refresh(this);
    size = iVar2 - iVar3;
  } while (bVar1);
  return iVar2 <= iVar3;
}

Assistant:

bool CodedInputStream::ReadRaw(void* buffer, int size) {
  return InternalReadRawInline(buffer, size);
}